

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void test_samplers(void)

{
  int iVar1;
  bool bVar2;
  float y;
  float x;
  Sampler s;
  
  create_samplers(&s,1);
  iVar1 = 2;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    sample_unit_square(&s,&x,&y,(float *)0x0);
    printf("%f %f\n",(double)x,(double)y);
  }
  return;
}

Assistant:

void test_samplers() {
    Sampler s;
    create_samplers(&s, 1);
    for (int i = 0; i < 2 * STRATIFIED_RESOLUTION * STRATIFIED_RESOLUTION; i++) {
        float x, y;
        sample_unit_square(&s, &x, &y, NULL);
        printf("%f %f\n", x, y);
    }
}